

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall
btSoftBody::defaultCollisionHandler(btSoftBody *this,btCollisionObjectWrapper *pcoWrap)

{
  btTransform *pbVar1;
  uint uVar2;
  btCollisionObject *pbVar3;
  float fVar4;
  float extraout_XMM0_Da;
  float fVar5;
  float fVar6;
  CollideSDF_RS docollide;
  btVector3 maxs;
  btVector3 mins;
  btDbvtAabbMm box;
  undefined1 local_b8 [12];
  btScalar bStack_ac;
  undefined8 uStack_a8;
  btScalar bStack_a0;
  undefined4 uStack_9c;
  float local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  btDbvtVolume local_68 [2];
  
  uVar2 = (this->m_cfg).collisions & 0xf;
  if (uVar2 == 2) {
    local_b8._8_4_ = 1.0;
    bStack_ac = 0.0;
    uStack_a8._0_4_ = 0.0;
    uStack_a8._4_4_ = 0.0;
    bStack_a0 = 0.0;
    local_b8._0_8_ = &PTR__ICollide_00229588;
    btSoftColliders::CollideCL_RS::ProcessColObj((CollideCL_RS *)local_b8,this,pcoWrap);
  }
  else if (uVar2 == 1) {
    local_b8._0_8_ = &PTR__ICollide_00229528;
    pbVar1 = pcoWrap->m_worldTransform;
    pbVar3 = (btCollisionObject *)0x0;
    if ((pcoWrap->m_collisionObject->m_internalType & 2) != 0) {
      pbVar3 = pcoWrap->m_collisionObject;
    }
    fVar5 = (pbVar1->m_origin).m_floats[0];
    fVar6 = (pbVar1->m_origin).m_floats[1];
    fVar4 = (pbVar1->m_origin).m_floats[2];
    fVar5 = fVar5 - fVar5;
    fVar6 = fVar6 - fVar6;
    fVar4 = fVar4 - fVar4;
    fVar5 = fVar4 * fVar4 + fVar5 * fVar5 + fVar6 * fVar6;
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
    (*pcoWrap->m_shape->_vptr_btCollisionShape[2])
              (pcoWrap->m_shape,pcoWrap->m_worldTransform,local_78,local_88);
    local_68[0].mi.m_floats[1] = SUB84(local_78._0_8_,4) - extraout_XMM0_Da;
    local_68[0].mi.m_floats[0] = (float)local_78._0_8_ - extraout_XMM0_Da;
    local_68[0].mi.m_floats[2] = (btScalar)local_78._8_8_;
    local_68[0].mi.m_floats[3] = SUB84(local_78._8_8_,4);
    local_68[0].mi.m_floats[2] = local_68[0].mi.m_floats[2] - extraout_XMM0_Da;
    local_68[0].mx.m_floats[1] = SUB84(local_88._0_8_,4) + extraout_XMM0_Da;
    local_68[0].mx.m_floats[0] = (float)local_88._0_8_ + extraout_XMM0_Da;
    local_68[0].mx.m_floats[2] = (btScalar)local_88._8_8_;
    local_68[0].mx.m_floats[3] = SUB84(local_88._8_8_,4);
    local_68[0].mx.m_floats[2] = local_68[0].mx.m_floats[2] + extraout_XMM0_Da;
    bStack_a0 = SUB84(pbVar3,0);
    uStack_9c = (undefined4)((ulong)pbVar3 >> 0x20);
    local_98 = fVar5 + extraout_XMM0_Da;
    unique0x1000036f = this;
    uStack_a8 = pcoWrap;
    btDbvt::collideTV(&this->m_ndbvt,(this->m_ndbvt).m_root,local_68,(ICollide *)local_b8);
  }
  return;
}

Assistant:

void			btSoftBody::defaultCollisionHandler(const btCollisionObjectWrapper* pcoWrap)
{

	switch(m_cfg.collisions&fCollision::RVSmask)
	{
	case	fCollision::SDF_RS:
		{
			btSoftColliders::CollideSDF_RS	docollide;		
			btRigidBody*		prb1=(btRigidBody*) btRigidBody::upcast(pcoWrap->getCollisionObject());
			btTransform	wtr=pcoWrap->getWorldTransform();

			const btTransform	ctr=pcoWrap->getWorldTransform();
			const btScalar		timemargin=(wtr.getOrigin()-ctr.getOrigin()).length();
			const btScalar		basemargin=getCollisionShape()->getMargin();
			btVector3			mins;
			btVector3			maxs;
			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume;
			pcoWrap->getCollisionShape()->getAabb(	pcoWrap->getWorldTransform(),
				mins,
				maxs);
			volume=btDbvtVolume::FromMM(mins,maxs);
			volume.Expand(btVector3(basemargin,basemargin,basemargin));		
			docollide.psb		=	this;
			docollide.m_colObj1Wrap = pcoWrap;
			docollide.m_rigidBody = prb1;

			docollide.dynmargin	=	basemargin+timemargin;
			docollide.stamargin	=	basemargin;
			m_ndbvt.collideTV(m_ndbvt.m_root,volume,docollide);
		}
		break;
	case	fCollision::CL_RS:
		{
			btSoftColliders::CollideCL_RS	collider;
			collider.ProcessColObj(this,pcoWrap);
		}
		break;
	}
}